

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void lzham::lzham_lib_set_memory_callbacks
               (lzham_realloc_func pRealloc,lzham_msize_func pMSize,void *pUser_data)

{
  void *pUser_data_local;
  lzham_msize_func pMSize_local;
  lzham_realloc_func pRealloc_local;
  
  if ((pRealloc == (lzham_realloc_func)0x0) ||
     (g_pRealloc = pRealloc, g_pMSize = pMSize, g_pUser_data = pUser_data,
     pMSize == (lzham_msize_func)0x0)) {
    g_pRealloc = lzham_default_realloc;
    g_pMSize = lzham_default_msize;
    g_pUser_data = (void *)0x0;
  }
  return;
}

Assistant:

void LZHAM_CDECL lzham_lib_set_memory_callbacks(lzham_realloc_func pRealloc, lzham_msize_func pMSize, void* pUser_data)
   {
      if ((!pRealloc) || (!pMSize))
      {
         g_pRealloc = lzham_default_realloc;
         g_pMSize = lzham_default_msize;
         g_pUser_data = NULL;
      }
      else
      {
         g_pRealloc = pRealloc;
         g_pMSize = pMSize;
         g_pUser_data = pUser_data;
      }
   }